

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  int iVar1;
  Rep *pRVar2;
  void **ppvVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  undefined1 *puVar7;
  string local_38;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  iVar1 = (description->input_).super_RepeatedPtrFieldBase.current_size_;
  if ((long)iVar1 == 0) {
    bVar4 = false;
  }
  else {
    lVar5 = 0;
    bVar4 = false;
    do {
      puVar7 = *(undefined1 **)(*(long *)((long)ppvVar3 + lVar5) + 0x20);
      if (puVar7 == (undefined1 *)0x0) {
        puVar7 = Specification::_FeatureType_default_instance_;
      }
      if (*(int *)(puVar7 + 0x24) == 8) {
        bVar4 = true;
        iVar6 = 3;
      }
      else {
        iVar6 = ((byte)puVar7[0x10] ^ 1) * 2;
        if (puVar7[0x10] == 0) {
          bVar4 = true;
        }
      }
    } while (((iVar6 == 3) || (iVar6 == 0)) && (lVar5 = lVar5 + 8, (long)iVar1 * 8 - lVar5 != 0));
  }
  if ((iVar1 < 1) || (bVar4)) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"At least one feature for a neural network must NOT be optional."
               ,"");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kStateType) { // ignore optionality for State type input (which is always non-optional)
                hasNotOptional = true;
                continue;
            }
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (description.input().size() > 0 && !hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }